

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *this)

{
  char cVar1;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *in_RDI;
  char c;
  int in_stack_00000044;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
  *in_stack_00000048;
  undefined1 in_stack_ffffffffffffffbf;
  NLHandler<mp::NullNLHandler<Expr>,_Expr> *in_stack_ffffffffffffffc0;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  CStringRef arg0;
  LogicalExpr local_4;
  
  arg0.data_ = (char *)in_RDI;
  cVar1 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
  switch(cVar1) {
  case 'l':
  case 'n':
  case 's':
    ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *)in_stack_ffffffffffffffe0.data_,'\0');
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnBool
                        (in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"expected logical expression");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)CONCAT17(cVar1,in_stack_ffffffffffffffe8),arg0);
    local_4 = OTHER;
    break;
  case 'o':
    ReadOpCode(in_RDI);
    local_4 = ReadLogicalExpr(in_stack_00000048,in_stack_00000044);
  }
  return local_4;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}